

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int begin_record_message(ptls_message_emitter_t *_self)

{
  undefined1 local_21;
  undefined1 local_20;
  undefined1 local_1f;
  undefined1 local_1e;
  undefined1 local_1d;
  int local_1c;
  ptls_message_emitter_t *ppStack_18;
  int ret;
  st_ptls_record_message_emitter_t *self;
  ptls_message_emitter_t *_self_local;
  
  _self[1].buf = (ptls_buffer_t *)_self->buf->off;
  local_21 = 0x16;
  local_20 = 3;
  local_1f = 3;
  local_1e = 0;
  local_1d = 0;
  ppStack_18 = _self;
  self = (st_ptls_record_message_emitter_t *)_self;
  local_1c = ptls_buffer__do_pushv(_self->buf,&local_21,5);
  if (local_1c == 0) {
    local_1c = 0;
  }
  return local_1c;
}

Assistant:

static int begin_record_message(ptls_message_emitter_t *_self)
{
    struct st_ptls_record_message_emitter_t *self = (void *)_self;
    int ret;

    self->rec_start = self->super.buf->off;
    ptls_buffer_push(self->super.buf, PTLS_CONTENT_TYPE_HANDSHAKE, PTLS_RECORD_VERSION_MAJOR, PTLS_RECORD_VERSION_MINOR, 0, 0);
    ret = 0;
Exit:
    return ret;
}